

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O2

int op_get_more(lua_State *L)

{
  int iVar1;
  int iVar2;
  lua_Integer lVar3;
  char *key;
  lua_Integer lVar4;
  char *buf_00;
  int sz_00;
  long lVar5;
  size_t sz;
  size_t cursor_len;
  buffer buf;
  
  iVar2 = 1;
  lVar3 = luaL_checkinteger(L,1);
  sz = 0;
  key = luaL_checklstring(L,2,&sz);
  lVar4 = luaL_checkinteger(L,3);
  cursor_len = 0;
  buf_00 = luaL_tolstring(L,4,&cursor_len);
  if (cursor_len == 8) {
    buf.ptr = buf.buffer;
    buf.size = 0;
    buf.cap = 0x80;
    iVar1 = reserve_length(&buf);
    write_int32(&buf,(int32_t)lVar3);
    write_int32(&buf,0);
    write_int32(&buf,0x7d5);
    write_int32(&buf,0);
    write_string(&buf,key,sz);
    write_int32(&buf,(int32_t)lVar4);
    write_bytes(&buf,buf_00,sz_00);
    lVar5 = (long)iVar1;
    buf.ptr[lVar5] = (uint8_t)buf.size;
    buf.ptr[lVar5 + 1] = buf.size._1_1_;
    buf.ptr[lVar5 + 2] = buf.size._2_1_;
    buf.ptr[lVar5 + 3] = buf.size._3_1_;
    lua_pushlstring(L,(char *)buf.ptr,(long)buf.size);
    buffer_destroy(&buf);
  }
  else {
    iVar2 = luaL_error(L,"Invalid cursor id");
  }
  return iVar2;
}

Assistant:

static int
op_get_more(lua_State *L) {
	int id = luaL_checkinteger(L, 1);
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int number = luaL_checkinteger(L, 3);
	size_t cursor_len = 0;
	const char * cursor_id = luaL_tolstring(L, 4, &cursor_len);
	if (cursor_len != 8) {
		return luaL_error(L, "Invalid cursor id");
	}

	struct buffer buf;
	buffer_create(&buf);
		int len = reserve_length(&buf);
		write_int32(&buf, id);
		write_int32(&buf, 0);
		write_int32(&buf, OP_GET_MORE);
		write_int32(&buf, 0);
		write_string(&buf, name, sz);
		write_int32(&buf, number);
		write_bytes(&buf, cursor_id, 8);
		write_length(&buf, buf.size, len);

		lua_pushlstring(L, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);

	return 1;
}